

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcFragDepthTests.cpp
# Opt level: O0

int __thiscall deqp::FragDepthTests::init(FragDepthTests *this,EVP_PKEY_CTX *ctx)

{
  TestNode *pTVar1;
  FragDepthWriteCase *this_00;
  long lVar2;
  ulong extraout_RAX;
  FragDepthCompareCase *this_01;
  ulong uVar3;
  uint local_34;
  int ndx_1;
  TestCaseGroup *compareGroup;
  int ndx;
  TestCaseGroup *writeGroup;
  FragDepthTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"write",
             "gl_FragDepth write tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  for (compareGroup._0_4_ = 0; (int)compareGroup < 9; compareGroup._0_4_ = (int)compareGroup + 1) {
    this_00 = (FragDepthWriteCase *)operator_new(0xa8);
    lVar2 = (long)(int)compareGroup;
    FragDepthWriteCase::FragDepthWriteCase
              (this_00,(this->super_TestCaseGroup).m_context,init::cases[lVar2].name,
               init::cases[lVar2].desc,this->m_glslVersion,init::cases[lVar2].fragSrc,
               init::cases[lVar2].evalFunc);
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_00);
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"compare",
             "gl_FragDepth used with depth comparison");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_34 = 0;
  uVar3 = extraout_RAX;
  while ((int)local_34 < 9) {
    this_01 = (FragDepthCompareCase *)operator_new(0xb0);
    lVar2 = (long)(int)local_34;
    FragDepthCompareCase::FragDepthCompareCase
              (this_01,(this->super_TestCaseGroup).m_context,init::cases[lVar2].name,
               init::cases[lVar2].desc,this->m_glslVersion,init::cases[lVar2].fragSrc,
               init::cases[lVar2].evalFunc,0x201);
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_01);
    local_34 = local_34 + 1;
    uVar3 = (ulong)local_34;
  }
  return (int)uVar3;
}

Assistant:

void FragDepthTests::init(void)
{
	static const struct
	{
		const char*		  name;
		const char*		  desc;
		EvalFragDepthFunc evalFunc;
		const char*		  fragSrc;
	} cases[] = {
		{ "no_write", "No gl_FragDepth write", evalNoWrite, "${VERSION_DECL}\n"
															"uniform highp vec4 u_color;\n"
															"layout(location = 0) out mediump vec4 o_color;\n"
															"void main (void)\n"
															"{\n"
															"   o_color = u_color;\n"
															"}\n" },
		{ "const", "Const depth write", evalConstDepth, "${VERSION_DECL}\n"
														"uniform highp vec4 u_color;\n"
														"layout(location = 0) out mediump vec4 o_color;\n"
														"void main (void)\n"
														"{\n"
														"   o_color = u_color;\n"
														"   gl_FragDepth = 0.5;\n"
														"}\n" },
		{ "uniform", "Uniform depth write", evalConstDepth, "${VERSION_DECL}\n"
															"uniform highp vec4 u_color;\n"
															"uniform highp float uf_half;\n"
															"layout(location = 0) out mediump vec4 o_color;\n"
															"void main (void)\n"
															"{\n"
															"   o_color = u_color;\n"
															"   gl_FragDepth = uf_half;\n"
															"}\n" },
		{ "dynamic", "Dynamic depth write", evalDynamicDepth, "${VERSION_DECL}\n"
															  "uniform highp vec4 u_color;\n"
															  "in highp vec2 v_coord;\n"
															  "layout(location = 0) out mediump vec4 o_color;\n"
															  "void main (void)\n"
															  "{\n"
															  "   o_color = u_color;\n"
															  "   gl_FragDepth = (v_coord.x+v_coord.y)*0.5;\n"
															  "}\n" },
		{ "fragcoord_z", "gl_FragDepth write from gl_FragCoord.z", evalNoWrite,
		  "${VERSION_DECL}\n"
		  "uniform highp vec4 u_color;\n"
		  "layout(location = 0) out mediump vec4 o_color;\n"
		  "void main (void)\n"
		  "{\n"
		  "   o_color = u_color;\n"
		  "   gl_FragDepth = gl_FragCoord.z;\n"
		  "}\n" },
		{ "uniform_conditional_write", "Uniform conditional write", evalDynamicDepth,
		  "${VERSION_DECL}\n"
		  "uniform highp vec4 u_color;\n"
		  "uniform bool ub_true;\n"
		  "in highp vec2 v_coord;\n"
		  "layout(location = 0) out mediump vec4 o_color;\n"
		  "void main (void)\n"
		  "{\n"
		  "   o_color = u_color;\n"
		  "   if (ub_true)\n"
		  "       gl_FragDepth = (v_coord.x+v_coord.y)*0.5;\n"
		  "}\n" },
		{ "dynamic_conditional_write", "Uniform conditional write", evalDynamicConditionalDepth,
		  "${VERSION_DECL}\n"
		  "uniform highp vec4 u_color;\n"
		  "uniform bool ub_true;\n"
		  "in highp vec2 v_coord;\n"
		  "layout(location = 0) out mediump vec4 o_color;\n"
		  "void main (void)\n"
		  "{\n"
		  "   o_color = u_color;\n"
		  "   mediump float d = (v_coord.x+v_coord.y)*0.5f;\n"
		  "   if (v_coord.y < 0.5)\n"
		  "       gl_FragDepth = d;\n"
		  "   else\n"
		  "       gl_FragDepth = 1.0 - d;\n"
		  "}\n" },
		{ "uniform_loop_write", "Uniform loop write", evalConstDepth, "${VERSION_DECL}\n"
																	  "uniform highp vec4 u_color;\n"
																	  "uniform int ui_two;\n"
																	  "uniform highp float uf_fourth;\n"
																	  "in highp vec2 v_coord;\n"
																	  "layout(location = 0) out mediump vec4 o_color;\n"
																	  "void main (void)\n"
																	  "{\n"
																	  "   o_color = u_color;\n"
																	  "   gl_FragDepth = 0.0;\n"
																	  "   for (int i = 0; i < ui_two; i++)\n"
																	  "       gl_FragDepth += uf_fourth;\n"
																	  "}\n" },
		{ "write_in_function", "Uniform loop write", evalDynamicDepth,
		  "${VERSION_DECL}\n"
		  "uniform highp vec4 u_color;\n"
		  "uniform highp float uf_half;\n"
		  "in highp vec2 v_coord;\n"
		  "layout(location = 0) out mediump vec4 o_color;\n"
		  "void myfunc (highp vec2 coord)\n"
		  "{\n"
		  "   gl_FragDepth = (coord.x+coord.y)*0.5;\n"
		  "}\n"
		  "void main (void)\n"
		  "{\n"
		  "   o_color = u_color;\n"
		  "   myfunc(v_coord);\n"
		  "}\n" }
	};

	// .write
	tcu::TestCaseGroup* writeGroup = new tcu::TestCaseGroup(m_testCtx, "write", "gl_FragDepth write tests");
	addChild(writeGroup);
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		writeGroup->addChild(new FragDepthWriteCase(m_context, cases[ndx].name, cases[ndx].desc, m_glslVersion,
													cases[ndx].fragSrc, cases[ndx].evalFunc));

	// .compare
	tcu::TestCaseGroup* compareGroup =
		new tcu::TestCaseGroup(m_testCtx, "compare", "gl_FragDepth used with depth comparison");
	addChild(compareGroup);
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		compareGroup->addChild(new FragDepthCompareCase(m_context, cases[ndx].name, cases[ndx].desc, m_glslVersion,
														cases[ndx].fragSrc, cases[ndx].evalFunc, GL_LESS));
}